

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O2

_Bool olsrv2_mpr_shall_forwarding
                (rfc5444_reader_tlvblock_context *context,netaddr *source_address,uint64_t vtime)

{
  netaddr *originator;
  uint8_t uVar1;
  oonf_rfc5444_interface *poVar2;
  long lVar3;
  oonf_rfc5444_protocol *poVar4;
  int iVar5;
  oonf_duplicate_result oVar6;
  avl_tree *paVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  ulong uVar13;
  char *pcVar14;
  netaddr_str buf;
  
  poVar4 = _protocol;
  if ((context->has_origaddr == true) && (context->has_seqno != false)) {
    poVar2 = (_protocol->input).interface;
    if (poVar2 == (oonf_rfc5444_interface *)0x0) {
      if (((&log_global_mask)[LOG_OLSRV2] & 1) == 0) {
        return false;
      }
      pcVar11 = "Do not forward because input interface is not set";
      uVar9 = 0x1c1;
    }
    else {
      if (source_address != (netaddr *)0x0) {
        iVar5 = strcmp(poVar2->name,"any");
        if (iVar5 == 0) {
          return false;
        }
        originator = &context->orig_addr;
        oVar6 = oonf_duplicate_entry_add
                          (&poVar4->forwarded_set,context->msg_type,originator,(ulong)context->seqno
                           ,vtime + _olsrv2_config.f_hold_time);
        if ((OONF_DUPSET_FIRST < oVar6) || ((0x34U >> (oVar6 & 0x1f) & 1) == 0)) {
          uVar13 = (ulong)LOG_OLSRV2;
          if (((&log_global_mask)[uVar13] & 1) == 0) {
            return false;
          }
          uVar1 = context->msg_type;
          uVar9 = netaddr_to_prefixstring(&buf,originator,0);
          oonf_log(1,uVar13,"src/olsrv2/olsrv2/olsrv2.c",0x1d7,0,0,
                   "Do not forward message type %u from %s with seqno %u (dupset result: %u)",uVar1,
                   uVar9,context->seqno,oVar6);
          return false;
        }
        poVar2 = (_protocol->input).interface;
        paVar7 = nhdp_interface_get_tree();
        lVar8 = avl_find(paVar7,poVar2);
        if (lVar8 == 0) {
          uVar13 = (ulong)LOG_OLSRV2;
          if (((&log_global_mask)[uVar13] & 1) == 0) {
            return false;
          }
          pcVar11 = "Do not forward because NHDP does not handle interface \'%s\'";
          uVar9 = 0x1e1;
        }
        else {
          lVar8 = avl_find(lVar8 + 0x70,source_address);
          if (lVar8 == 0) {
            uVar13 = (ulong)LOG_OLSRV2;
            if (((&log_global_mask)[uVar13] & 1) == 0) {
              return false;
            }
            netaddr_to_prefixstring(&buf,source_address,0);
            pcVar11 = "Do not forward because source IP %s is not a direct neighbor";
            uVar9 = 0x1eb;
          }
          else {
            lVar3 = *(long *)(lVar8 + -0x80);
            lVar10 = lVar3;
            if (((context->orig_addr)._type == source_address->_type) ||
               (lVar10 = *(long *)(lVar3 + 0x140), lVar10 != 0)) {
              lVar10 = *(long *)(lVar10 + 0x148);
              if (*(char *)(lVar3 + 0x180) == '\x01') {
                bVar12 = 0 < *(int *)(lVar10 + 0x14);
              }
              else {
                bVar12 = false;
              }
              uVar13 = (ulong)LOG_OLSRV2;
              if (((&log_global_mask)[uVar13] & 1) != 0) {
                pcVar11 = "not ";
                if (bVar12 != false) {
                  pcVar11 = "";
                }
                uVar1 = context->msg_type;
                uVar9 = netaddr_to_prefixstring(&buf,originator,0);
                pcVar14 = "false";
                if (*(char *)(*(long *)(lVar8 + -0x80) + 0x180) != '\0') {
                  pcVar14 = "true";
                }
                oonf_log(1,uVar13,"src/olsrv2/olsrv2/olsrv2.c",0x205,0,0,
                         "Do %sforward message type %u from %s with seqno %u (%s/%u)",pcVar11,uVar1,
                         uVar9,context->seqno,pcVar14,*(undefined4 *)(lVar10 + 0x14));
                return bVar12;
              }
              return bVar12;
            }
            uVar13 = (ulong)LOG_OLSRV2;
            if (((&log_global_mask)[uVar13] & 1) == 0) {
              return false;
            }
            netaddr_to_prefixstring(&buf,source_address,0);
            pcVar11 = 
            "Do not forward because this is a dualstack message, but the link source %s is not dualstack capable"
            ;
            uVar9 = 0x1fb;
          }
        }
        goto LAB_0012fba5;
      }
      if (((&log_global_mask)[LOG_OLSRV2] & 1) == 0) {
        return false;
      }
      pcVar11 = "Do not forward because input source is not set";
      uVar9 = 0x1c7;
    }
    uVar13 = (ulong)LOG_OLSRV2;
  }
  else {
    uVar13 = (ulong)LOG_OLSRV2;
    if (((&log_global_mask)[uVar13] & 1) == 0) {
      return false;
    }
    pcVar11 = "Do not forward message type %u, originator or sequence number is missing!";
    uVar9 = 0x1bb;
  }
LAB_0012fba5:
  oonf_log(1,uVar13,"src/olsrv2/olsrv2/olsrv2.c",uVar9,0,0,pcVar11);
  return false;
}

Assistant:

bool
olsrv2_mpr_shall_forwarding(
  struct rfc5444_reader_tlvblock_context *context, struct netaddr *source_address, uint64_t vtime) {
  struct nhdp_interface *interf;
  struct nhdp_laddr *laddr;
  struct nhdp_neighbor *neigh;
  enum oonf_duplicate_result dup_result;
  bool forward;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check input interface */
  if (_protocol->input.interface == NULL) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input interface is not set");
    return false;
  }

  /* check input source address */
  if (!source_address) {
    OONF_DEBUG(LOG_OLSRV2, "Do not forward because input source is not set");
    return false;
  }

  /* check if this is coming from the unicast receiver */
  if (strcmp(_protocol->input.interface->name, RFC5444_UNICAST_INTERFACE) == 0) {
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->forwarded_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  if (!oonf_duplicate_is_new(dup_result)) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward message type %u from %s"
      " with seqno %u (dupset result: %u)",
      context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
    return false;
  }

  /* get NHDP interface */
  interf = nhdp_interface_get(_protocol->input.interface->name);
  if (interf == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because NHDP does not handle"
      " interface '%s'",
      _protocol->input.interface->name);
    return false;
  }

  /* get NHDP link address corresponding to source */
  laddr = nhdp_interface_get_link_addr(interf, source_address);
  if (laddr == NULL) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because source IP %s is"
      " not a direct neighbor",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  if (netaddr_get_address_family(&context->orig_addr) == netaddr_get_address_family(source_address)) {
    /* get NHDP neighbor */
    neigh = laddr->link->neigh;
  }
  else if (laddr->link->dualstack_partner) {
    /* get dualstack NHDP neighbor */
    neigh = laddr->link->dualstack_partner->neigh;
  }
  else {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not forward because this is a dualstack"
      " message, but the link source %s is not dualstack capable",
      netaddr_to_string(&buf, source_address));
    return false;
  }

  /* forward if this neighbor has selected us as a flooding MPR */
  forward = laddr->link->local_is_flooding_mpr && neigh->symmetric > 0;
  OONF_DEBUG(LOG_OLSRV2,
    "Do %sforward message type %u from %s"
    " with seqno %u (%s/%u)",
    forward ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno,
    laddr->link->local_is_flooding_mpr ? "true" : "false", neigh->symmetric);
  return forward;
}